

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssl_session.cc
# Opt level: O3

UniquePtr<SSL_SESSION> __thiscall
bssl::SSL_SESSION_dup(bssl *this,SSL_SESSION *session,int dup_flags)

{
  byte bVar1;
  CRYPTO_BUFFER *pCVar2;
  uchar *puVar3;
  size_t sVar4;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  uint32_t uVar8;
  ssl_session_st *psVar9;
  byte bVar10;
  bool bVar11;
  _Head_base<0UL,_ssl_session_st_*,_false> _Var12;
  char *pcVar13;
  OPENSSL_STACK *pOVar14;
  ptrdiff_t _Num_1;
  ptrdiff_t _Num;
  Array<unsigned_char> *pAVar15;
  ptrdiff_t _Num_4;
  pointer __p;
  UniquePtr<SSL_SESSION> new_session;
  _Head_base<0UL,_ssl_session_st_*,_false> local_48;
  uint local_3c;
  _Head_base<0UL,_crypto_buffer_st_*,_false> local_38;
  
  local_38._M_head_impl = (crypto_buffer_st *)session->x509_method;
  local_3c = dup_flags;
  _Var12._M_head_impl =
       New<ssl_session_st,bssl::SSL_X509_METHOD_const*&>((SSL_X509_METHOD **)&local_38);
  local_48._M_head_impl = _Var12._M_head_impl;
  if (_Var12._M_head_impl != (ssl_session_st *)0x0) {
    bVar10 = session->field_0x1b8 & 0x10;
    bVar1 = (_Var12._M_head_impl)->field_0x1b8;
    (_Var12._M_head_impl)->field_0x1b8 = bVar1 & 0xef | bVar10;
    (_Var12._M_head_impl)->ssl_version = session->ssl_version;
    (_Var12._M_head_impl)->field_0x1b8 = bVar1 & 0xcf | bVar10 | session->field_0x1b8 & 0x20;
    if (_Var12._M_head_impl != session) {
      bVar1 = (session->sid_ctx).size_;
      if (0x20 < (ulong)bVar1) goto LAB_0015aff8;
      ((_Var12._M_head_impl)->sid_ctx).size_ = '\0';
      if (bVar1 != 0) {
        memmove(&(_Var12._M_head_impl)->sid_ctx,&session->sid_ctx,(ulong)bVar1);
      }
      ((_Var12._M_head_impl)->sid_ctx).size_ = bVar1;
      bVar1 = (session->secret).size_;
      if (0x40 < (ulong)bVar1) goto LAB_0015aff8;
      ((_Var12._M_head_impl)->secret).size_ = '\0';
      if (bVar1 != 0) {
        memmove(&(_Var12._M_head_impl)->secret,&session->secret,(ulong)bVar1);
      }
      ((_Var12._M_head_impl)->secret).size_ = bVar1;
    }
    (_Var12._M_head_impl)->cipher = session->cipher;
    pcVar13 = (session->psk_identity)._M_t.super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t
              .super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_char_*,_false>._M_head_impl;
    if (pcVar13 != (char *)0x0) {
      pcVar13 = OPENSSL_strdup(pcVar13);
      std::__uniq_ptr_impl<char,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<char,_bssl::internal::Deleter> *)
                 &(_Var12._M_head_impl)->psk_identity,pcVar13);
      _Var12._M_head_impl = local_48._M_head_impl;
      if (((local_48._M_head_impl)->psk_identity)._M_t.
          super___uniq_ptr_impl<char,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_char_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_char_*,_false>._M_head_impl == (char *)0x0) goto LAB_0015afd7;
    }
    pOVar14 = (OPENSSL_STACK *)
              (session->certs)._M_t.
              super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
              super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
              super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl;
    if (pOVar14 != (OPENSSL_STACK *)0x0) {
      pOVar14 = OPENSSL_sk_deep_copy
                          (pOVar14,sk_CRYPTO_BUFFER_call_copy_func,
                           SSL_SESSION_dup::anon_class_1_0_00000001::__invoke,
                           sk_CRYPTO_BUFFER_call_free_func,CRYPTO_BUFFER_free);
      std::__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter> *)
                 &(_Var12._M_head_impl)->certs,(pointer)pOVar14);
      _Var12._M_head_impl = local_48._M_head_impl;
      if (((local_48._M_head_impl)->certs)._M_t.
          super___uniq_ptr_impl<stack_st_CRYPTO_BUFFER,_bssl::internal::Deleter>._M_t.
          super__Tuple_impl<0UL,_stack_st_CRYPTO_BUFFER_*,_bssl::internal::Deleter>.
          super__Head_base<0UL,_stack_st_CRYPTO_BUFFER_*,_false>._M_head_impl ==
          (stack_st_CRYPTO_BUFFER *)0x0) goto LAB_0015afd7;
    }
    bVar11 = (*session->x509_method->session_dup)(_Var12._M_head_impl,session);
    if (bVar11) {
      (local_48._M_head_impl)->verify_result = session->verify_result;
      pCVar2 = (session->ocsp_response)._M_t.
               super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
      if (pCVar2 != (CRYPTO_BUFFER *)0x0) {
        CRYPTO_BUFFER_up_ref(pCVar2);
      }
      local_38._M_head_impl = (crypto_buffer_st *)0x0;
      std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
                 &(local_48._M_head_impl)->ocsp_response,pCVar2);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_38);
      pCVar2 = (session->signed_cert_timestamp_list)._M_t.
               super___uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>._M_t.
               super__Tuple_impl<0UL,_crypto_buffer_st_*,_bssl::internal::Deleter>.
               super__Head_base<0UL,_crypto_buffer_st_*,_false>._M_head_impl;
      if (pCVar2 != (CRYPTO_BUFFER *)0x0) {
        CRYPTO_BUFFER_up_ref(pCVar2);
      }
      local_38._M_head_impl = (crypto_buffer_st *)0x0;
      std::__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter>::reset
                ((__uniq_ptr_impl<crypto_buffer_st,_bssl::internal::Deleter> *)
                 &(local_48._M_head_impl)->signed_cert_timestamp_list,pCVar2);
      std::unique_ptr<crypto_buffer_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<crypto_buffer_st,_bssl::internal::Deleter> *)&local_38);
      _Var12._M_head_impl = local_48._M_head_impl;
      uVar5 = *(undefined8 *)session->peer_sha256;
      uVar6 = *(undefined8 *)(session->peer_sha256 + 8);
      uVar7 = *(undefined8 *)(session->peer_sha256 + 0x18);
      *(undefined8 *)((local_48._M_head_impl)->peer_sha256 + 0x10) =
           *(undefined8 *)(session->peer_sha256 + 0x10);
      *(undefined8 *)((local_48._M_head_impl)->peer_sha256 + 0x18) = uVar7;
      *(undefined8 *)(local_48._M_head_impl)->peer_sha256 = uVar5;
      *(undefined8 *)((local_48._M_head_impl)->peer_sha256 + 8) = uVar6;
      (local_48._M_head_impl)->field_0x1b8 =
           (local_48._M_head_impl)->field_0x1b8 & 0xfd | session->field_0x1b8 & 2;
      (local_48._M_head_impl)->peer_signature_algorithm = session->peer_signature_algorithm;
      uVar8 = session->auth_timeout;
      psVar9 = local_48._M_head_impl;
      psVar9->timeout = session->timeout;
      psVar9->auth_timeout = uVar8;
      (local_48._M_head_impl)->time = session->time;
      if ((local_3c & 2) == 0) {
LAB_0015ad6f:
        if ((local_3c & 1) != 0) {
          puVar3 = (session->ticket).data_;
          sVar4 = (session->ticket).size_;
          pAVar15 = &(local_48._M_head_impl)->ticket;
          bVar11 = Array<unsigned_char>::InitUninitialized(pAVar15,sVar4);
          if (bVar11 && sVar4 != 0) {
            memmove(pAVar15->data_,puVar3,sVar4);
          }
          if (!bVar11) goto LAB_0015afd7;
        }
        (local_48._M_head_impl)->field_0x1b8 = (local_48._M_head_impl)->field_0x1b8 | 4;
        *(ssl_session_st **)this = local_48._M_head_impl;
        local_48._M_head_impl = (ssl_session_st *)0x0;
        goto LAB_0015afde;
      }
      if (local_48._M_head_impl == session) {
        (local_48._M_head_impl)->group_id = session->group_id;
      }
      else {
        bVar1 = (session->session_id).size_;
        if (0x20 < (ulong)bVar1) {
LAB_0015aff8:
          abort();
        }
        ((local_48._M_head_impl)->session_id).size_ = '\0';
        if (bVar1 != 0) {
          memmove(&(local_48._M_head_impl)->session_id,&session->session_id,(ulong)bVar1);
        }
        ((_Var12._M_head_impl)->session_id).size_ = bVar1;
        (_Var12._M_head_impl)->group_id = session->group_id;
        bVar1 = (session->original_handshake_hash).size_;
        if (0x40 < (ulong)bVar1) goto LAB_0015aff8;
        ((_Var12._M_head_impl)->original_handshake_hash).size_ = '\0';
        if (bVar1 != 0) {
          memmove(&(_Var12._M_head_impl)->original_handshake_hash,&session->original_handshake_hash,
                  (ulong)bVar1);
        }
        ((_Var12._M_head_impl)->original_handshake_hash).size_ = bVar1;
      }
      uVar8 = session->ticket_age_add;
      psVar9->ticket_lifetime_hint = session->ticket_lifetime_hint;
      psVar9->ticket_age_add = uVar8;
      (_Var12._M_head_impl)->ticket_max_early_data = session->ticket_max_early_data;
      bVar10 = session->field_0x1b8 & 1;
      bVar1 = (_Var12._M_head_impl)->field_0x1b8;
      (_Var12._M_head_impl)->field_0x1b8 = bVar1 & 0xfe | bVar10;
      (_Var12._M_head_impl)->field_0x1b8 = bVar1 & 0xbe | bVar10 | session->field_0x1b8 & 0x40;
      puVar3 = (session->early_alpn).data_;
      sVar4 = (session->early_alpn).size_;
      bVar11 = Array<unsigned_char>::InitUninitialized(&(_Var12._M_head_impl)->early_alpn,sVar4);
      if (bVar11 && sVar4 != 0) {
        memmove(((_Var12._M_head_impl)->early_alpn).data_,puVar3,sVar4);
      }
      if (bVar11) {
        puVar3 = (session->quic_early_data_context).data_;
        sVar4 = (session->quic_early_data_context).size_;
        pAVar15 = &(local_48._M_head_impl)->quic_early_data_context;
        bVar11 = Array<unsigned_char>::InitUninitialized(pAVar15,sVar4);
        if (bVar11 && sVar4 != 0) {
          memmove(pAVar15->data_,puVar3,sVar4);
        }
        if (bVar11) {
          puVar3 = (session->local_application_settings).data_;
          sVar4 = (session->local_application_settings).size_;
          pAVar15 = &(local_48._M_head_impl)->local_application_settings;
          bVar11 = Array<unsigned_char>::InitUninitialized(pAVar15,sVar4);
          if (bVar11 && sVar4 != 0) {
            memmove(pAVar15->data_,puVar3,sVar4);
          }
          if (bVar11) {
            puVar3 = (session->peer_application_settings).data_;
            sVar4 = (session->peer_application_settings).size_;
            pAVar15 = &(local_48._M_head_impl)->peer_application_settings;
            bVar11 = Array<unsigned_char>::InitUninitialized(pAVar15,sVar4);
            if (bVar11 && sVar4 != 0) {
              memmove(pAVar15->data_,puVar3,sVar4);
            }
            if (bVar11) goto LAB_0015ad6f;
          }
        }
      }
    }
  }
LAB_0015afd7:
  *(undefined8 *)this = 0;
LAB_0015afde:
  std::unique_ptr<ssl_session_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ssl_session_st,_bssl::internal::Deleter> *)&local_48);
  return (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)
         (__uniq_ptr_data<ssl_session_st,_bssl::internal::Deleter,_true,_true>)this;
}

Assistant:

UniquePtr<SSL_SESSION> SSL_SESSION_dup(SSL_SESSION *session, int dup_flags) {
  UniquePtr<SSL_SESSION> new_session = ssl_session_new(session->x509_method);
  if (!new_session) {
    return nullptr;
  }

  new_session->is_server = session->is_server;
  new_session->ssl_version = session->ssl_version;
  new_session->is_quic = session->is_quic;
  new_session->sid_ctx = session->sid_ctx;

  // Copy the key material.
  new_session->secret = session->secret;
  new_session->cipher = session->cipher;

  // Copy authentication state.
  if (session->psk_identity != nullptr) {
    new_session->psk_identity.reset(
        OPENSSL_strdup(session->psk_identity.get()));
    if (new_session->psk_identity == nullptr) {
      return nullptr;
    }
  }
  if (session->certs != nullptr) {
    auto buf_up_ref = [](const CRYPTO_BUFFER *buf) {
      CRYPTO_BUFFER_up_ref(const_cast<CRYPTO_BUFFER *>(buf));
      return const_cast<CRYPTO_BUFFER *>(buf);
    };
    new_session->certs.reset(sk_CRYPTO_BUFFER_deep_copy(
        session->certs.get(), buf_up_ref, CRYPTO_BUFFER_free));
    if (new_session->certs == nullptr) {
      return nullptr;
    }
  }

  if (!session->x509_method->session_dup(new_session.get(), session)) {
    return nullptr;
  }

  new_session->verify_result = session->verify_result;

  new_session->ocsp_response = UpRef(session->ocsp_response);
  new_session->signed_cert_timestamp_list =
      UpRef(session->signed_cert_timestamp_list);

  OPENSSL_memcpy(new_session->peer_sha256, session->peer_sha256,
                 SHA256_DIGEST_LENGTH);
  new_session->peer_sha256_valid = session->peer_sha256_valid;

  new_session->peer_signature_algorithm = session->peer_signature_algorithm;

  new_session->timeout = session->timeout;
  new_session->auth_timeout = session->auth_timeout;
  new_session->time = session->time;

  // Copy non-authentication connection properties.
  if (dup_flags & SSL_SESSION_INCLUDE_NONAUTH) {
    new_session->session_id = session->session_id;
    new_session->group_id = session->group_id;
    new_session->original_handshake_hash = session->original_handshake_hash;
    new_session->ticket_lifetime_hint = session->ticket_lifetime_hint;
    new_session->ticket_age_add = session->ticket_age_add;
    new_session->ticket_max_early_data = session->ticket_max_early_data;
    new_session->extended_master_secret = session->extended_master_secret;
    new_session->has_application_settings = session->has_application_settings;

    if (!new_session->early_alpn.CopyFrom(session->early_alpn) ||
        !new_session->quic_early_data_context.CopyFrom(
            session->quic_early_data_context) ||
        !new_session->local_application_settings.CopyFrom(
            session->local_application_settings) ||
        !new_session->peer_application_settings.CopyFrom(
            session->peer_application_settings)) {
      return nullptr;
    }
  }

  // Copy the ticket.
  if (dup_flags & SSL_SESSION_INCLUDE_TICKET &&
      !new_session->ticket.CopyFrom(session->ticket)) {
    return nullptr;
  }

  // The new_session does not get a copy of the ex_data.

  new_session->not_resumable = true;
  return new_session;
}